

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_benchmarker.hpp
# Opt level: O0

TestDescriptor *
hayai::Benchmarker::RegisterTest
          (char *fixtureName,char *testName,size_t runs,size_t iterations,TestFactory *testFactory,
          TestParametersDescriptor *parameters)

{
  TestParametersDescriptor *testFactory_00;
  TestFactory *iterations_00;
  size_t runs_00;
  size_t testName_00;
  char *fixtureName_00;
  int iVar1;
  size_t sVar2;
  TestDescriptor *this;
  Benchmarker *pBVar3;
  byte local_6e;
  TestParametersDescriptor local_60;
  TestDescriptor *local_48;
  TestDescriptor *descriptor;
  TestParametersDescriptor *pTStack_38;
  bool isDisabled;
  TestParametersDescriptor *parameters_local;
  TestFactory *testFactory_local;
  size_t iterations_local;
  size_t runs_local;
  char *testName_local;
  char *fixtureName_local;
  
  pTStack_38 = parameters;
  parameters_local = (TestParametersDescriptor *)testFactory;
  testFactory_local = (TestFactory *)iterations;
  iterations_local = runs;
  runs_local = (size_t)testName;
  testName_local = fixtureName;
  sVar2 = strlen(testName);
  local_6e = 0;
  if (8 < sVar2) {
    iVar1 = memcmp((void *)runs_local,RegisterTest::disabledPrefix,9);
    local_6e = iVar1 != 0 ^ 0xff;
  }
  descriptor._7_1_ = local_6e & 1;
  if (descriptor._7_1_ != 0) {
    runs_local = runs_local + 9;
  }
  this = (TestDescriptor *)operator_new(0x98);
  fixtureName_00 = testName_local;
  testName_00 = runs_local;
  runs_00 = iterations_local;
  iterations_00 = testFactory_local;
  testFactory_00 = parameters_local;
  TestParametersDescriptor::TestParametersDescriptor(&local_60,parameters);
  TestDescriptor::TestDescriptor
            (this,fixtureName_00,(char *)testName_00,runs_00,(size_t)iterations_00,
             (TestFactory *)testFactory_00,&local_60,(bool)(descriptor._7_1_ & 1));
  TestParametersDescriptor::~TestParametersDescriptor(&local_60);
  local_48 = this;
  pBVar3 = Instance();
  inja::std::vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>::push_back
            (&pBVar3->_tests,&local_48);
  return local_48;
}

Assistant:

static TestDescriptor* RegisterTest(
            const char* fixtureName,
            const char* testName,
            std::size_t runs,
            std::size_t iterations,
            TestFactory* testFactory,
            TestParametersDescriptor parameters
        )
        {
            // Determine if the test has been disabled.
            static const char* disabledPrefix = "DISABLED_";
            bool isDisabled = ((::strlen(testName) >= 9) &&
                               (!::memcmp(testName, disabledPrefix, 9)));

            if (isDisabled)
                testName += 9;

            // Add the descriptor.
            TestDescriptor* descriptor = new TestDescriptor(fixtureName,
                                                            testName,
                                                            runs,
                                                            iterations,
                                                            testFactory,
                                                            parameters,
                                                            isDisabled);

            Instance()._tests.push_back(descriptor);

            return descriptor;
        }